

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_var_to_local.cpp
# Opt level: O0

void __thiscall
optimization::global_var_to_local::Global_Var_to_Local::optimize_func
          (Global_Var_to_Local *this,MirFunction *func,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *global_vars)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  size_type sVar4;
  pointer ppVar5;
  pointer pIVar6;
  type this_00;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  uint extraout_EDX;
  pointer_____offset_0x10___ *__s;
  undefined1 auVar9 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  RefInst *ref;
  Inst *i;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range2;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *insts;
  key_type *in_stack_ffffffffffffff58;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff60;
  key_type *__x;
  key_type local_78;
  key_type *local_58;
  type local_50;
  reference local_48;
  pointer_____offset_0x10___ local_40;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_38;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_30;
  _Base_ptr local_28;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_20;
  
  sVar3 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1f4fbc);
  if ((sVar3 != 0) &&
     (sVar4 = std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::size((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                      *)0x1f4fd3), sVar4 != 0)) {
    local_28 = (_Base_ptr)
               std::
               map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
               ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                        *)in_stack_ffffffffffffff58);
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x1f5004);
    local_30 = &(ppVar5->second).inst;
    local_20 = local_30;
    local_38._M_current =
         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
         std::
         vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)in_stack_ffffffffffffff58);
    local_40 = (pointer_____offset_0x10___)
               std::
               vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      *)in_stack_ffffffffffffff58);
    while( true ) {
      __s = &local_40;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                          *)in_stack_ffffffffffffff60,
                         (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                          *)in_stack_ffffffffffffff58);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                 ::operator*(&local_38);
      pIVar6 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          0x1f5070);
      iVar2 = (*(pIVar6->super_Displayable)._vptr_Displayable[1])();
      if (iVar2 == 2) {
        this_00 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator*
                            ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             in_stack_ffffffffffffff60);
        local_50 = this_00;
        if (this_00 == (type)0x0) {
          auVar9._4_8_ = 0;
          auVar9._0_4_ = extraout_EDX;
          auVar9 = auVar9 << 0x40;
        }
        else {
          __s = &mir::inst::Inst::typeinfo;
          auVar9 = __dynamic_cast(this_00,&mir::inst::Inst::typeinfo,&mir::inst::RefInst::typeinfo,0
                                 );
        }
        __x = auVar9._0_8_;
        local_58 = __x;
        pcVar7 = std::
                 variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::index((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)&__x->field_2 + 8),(char *)__s,auVar9._8_4_);
        if (pcVar7 == (char *)0x1) {
          pbVar8 = std::get<std::__cxx11::string,mir::inst::VarId,std::__cxx11::string>
                             ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)0x1f50f9);
          in_stack_ffffffffffffff58 = &local_78;
          std::__cxx11::string::string((string *)in_stack_ffffffffffffff58,(string *)pbVar8);
          in_stack_ffffffffffffff60 =
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this_00,__x);
          if (in_stack_ffffffffffffff60 !=
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::erase(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
          }
          std::__cxx11::string::~string((string *)&local_78);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
      ::operator++(&local_38);
    }
  }
  return;
}

Assistant:

void Global_Var_to_Local::optimize_func(mir::inst::MirFunction& func,
                                        std::set<std::string>& global_vars) {
  if (!global_vars.size() || !func.basic_blks.size()) {
    return;
  }
  auto& insts = func.basic_blks.begin()->second.inst;
  for (auto& inst : insts) {
    if (inst->inst_kind() == mir::inst::InstKind::Ref) {
      auto& i = *inst;
      auto ref = dynamic_cast<mir::inst::RefInst*>(&i);
      if (ref->val.index() == 1) {
        auto s = std::get<std::string>(ref->val);
        if (global_vars.count(s)) {
          global_vars.erase(s);
        }
      }
    }
  }
}